

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

string * __thiscall helics::CoreBroker::generateRename_abi_cxx11_(CoreBroker *this,string_view name)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  this_00;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  iterator renamer;
  size_type cntLoc;
  string *newName;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  string *__pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_48;
  size_type local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22;
  
  local_22._M_dataplus._M_p._1_1_ = 0;
  this_01 = &local_22;
  __pos = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
             ,(allocator<char> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  local_40 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (in_RSI,(char *)in_RDI,in_stack_ffffffffffffff50);
  if (local_40 != 0xffffffffffffffff) {
    this_00._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                (key_type *)0x510c43);
    local_48._M_cur = this_00._M_cur;
    local_50._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    bVar1 = CLI::std::__detail::operator==(&local_48,&local_50);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (this_01,(size_type)__pos,(size_type)in_RSI,(char *)in_RDI);
      std::
      unordered_map<std::__cxx11::string,long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
      ::emplace<std::basic_string_view<char,std::char_traits<char>>&,int>
                ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)this_00._M_cur,in_stack_ffffffffffffff48,(int *)in_stack_ffffffffffffff40);
    }
    else {
      CLI::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_false,_true>
                    *)0x510ca4);
      CLI::std::__cxx11::to_string(CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (this_01,(size_type)__pos,(size_type)in_RSI,in_RDI);
      std::__cxx11::string::~string(in_stack_ffffffffffffff40);
      ppVar2 = CLI::std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_false,_true>
                             *)0x510ce9);
      ppVar2->second = ppVar2->second + 1;
    }
  }
  return in_RDI;
}

Assistant:

std::string CoreBroker::generateRename(std::string_view name)
{
    std::string newName{name};
    auto cntLoc = newName.find("${#}");
    if (cntLoc != std::string::npos) {
        auto renamer = renamers.find(newName);
        if (renamer != renamers.end()) {
            newName.replace(cntLoc, 4, std::to_string(renamer->second + 1));
            renamer->second++;
        } else {
            newName.replace(cntLoc, 4, "1");
            renamers.emplace(name, 1);
        }
    }
    return newName;
}